

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O0

BOOL Silent_ExtractFormatA
               (LPCSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,LPINT Precision,LPINT Prefix,
               LPINT Type)

{
  CHAR *pCVar1;
  LPCSTR pCVar2;
  int iVar3;
  size_t sVar4;
  char *__nptr;
  undefined1 *puVar5;
  LPINT piVar6;
  bool bVar7;
  char *local_58;
  LPSTR TempStrPtr;
  LPSTR TempStr;
  BOOL Result;
  LPINT Prefix_local;
  LPINT Precision_local;
  LPINT Width_local;
  LPINT Flags_local;
  LPSTR Out_local;
  LPCSTR *Fmt_local;
  
  TempStr._4_4_ = 0;
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  if ((*Fmt == (LPCSTR)0x0) || (**Fmt != '%')) {
    Fmt_local._4_4_ = 0;
  }
  else {
    pCVar1 = *Fmt;
    *Fmt = pCVar1 + 1;
    Flags_local = (LPINT)(Out + 1);
    *Out = *pCVar1;
    sVar4 = strlen(*Fmt);
    __nptr = (char *)PAL_malloc(sVar4 + 1);
    if (__nptr == (char *)0x0) {
      Fmt_local._4_4_ = 0;
    }
    else {
      while( true ) {
        bVar7 = false;
        if ((((**Fmt != '\0') && (bVar7 = true, **Fmt != '-')) && (bVar7 = true, **Fmt != '+')) &&
           ((bVar7 = true, **Fmt != '0' && (bVar7 = true, **Fmt != ' ')))) {
          bVar7 = **Fmt == '#';
        }
        if (!bVar7) break;
        switch(**Fmt) {
        case ' ':
          *Flags = *Flags | 8;
          break;
        case '#':
          *Flags = *Flags | 2;
          break;
        case '+':
          *Flags = *Flags | 0x10;
          break;
        case '-':
          *Flags = *Flags | 1;
          break;
        case '0':
          *Flags = *Flags | 4;
        }
        pCVar2 = *Fmt;
        *Fmt = pCVar2 + 1;
        *(CHAR *)Flags_local = *pCVar2;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      if (((*Flags & 1U) != 0) && ((*Flags & 4U) != 0)) {
        *Flags = *Flags + -4;
      }
      iVar3 = isdigit((uint)(byte)**Fmt);
      local_58 = __nptr;
      if (iVar3 == 0) {
        if (**Fmt == '*') {
          *Width = -2;
          pCVar2 = *Fmt;
          *Fmt = pCVar2 + 1;
          piVar6 = (LPINT)((long)Flags_local + 1);
          *(CHAR *)Flags_local = *pCVar2;
          iVar3 = isdigit((uint)(byte)**Fmt);
          Flags_local = piVar6;
          if (iVar3 != 0) {
            *Width = -3;
            while (iVar3 = isdigit((uint)(byte)**Fmt), iVar3 != 0) {
              pCVar2 = *Fmt;
              *Fmt = pCVar2 + 1;
              *(CHAR *)Flags_local = *pCVar2;
              Flags_local = (LPINT)((long)Flags_local + 1);
            }
          }
        }
      }
      else {
        while (iVar3 = isdigit((uint)(byte)**Fmt), iVar3 != 0) {
          *local_58 = **Fmt;
          pCVar2 = *Fmt;
          *Fmt = pCVar2 + 1;
          *(CHAR *)Flags_local = *pCVar2;
          local_58 = local_58 + 1;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        *local_58 = '\0';
        iVar3 = atoi(__nptr);
        *Width = iVar3;
        if (*Width < 0) {
          SetLastError(0x54f);
          return 0;
        }
      }
      if (**Fmt == '.') {
        pCVar2 = *Fmt;
        *Fmt = pCVar2 + 1;
        piVar6 = (LPINT)((long)Flags_local + 1);
        *(CHAR *)Flags_local = *pCVar2;
        iVar3 = isdigit((uint)(byte)**Fmt);
        local_58 = __nptr;
        if (iVar3 == 0) {
          if (**Fmt == '*') {
            *Precision = -2;
            pCVar2 = *Fmt;
            *Fmt = pCVar2 + 1;
            Flags_local = (LPINT)((long)Flags_local + 2);
            *(CHAR *)piVar6 = *pCVar2;
            iVar3 = isdigit((uint)(byte)**Fmt);
            if (iVar3 != 0) {
              *Precision = -4;
              while (iVar3 = isdigit((uint)(byte)**Fmt), iVar3 != 0) {
                pCVar2 = *Fmt;
                *Fmt = pCVar2 + 1;
                *(CHAR *)Flags_local = *pCVar2;
                Flags_local = (LPINT)((long)Flags_local + 1);
              }
            }
          }
          else {
            *Precision = -3;
            Flags_local = piVar6;
          }
        }
        else {
          while (Flags_local = piVar6, iVar3 = isdigit((uint)(byte)**Fmt), iVar3 != 0) {
            *local_58 = **Fmt;
            pCVar2 = *Fmt;
            *Fmt = pCVar2 + 1;
            *(CHAR *)Flags_local = *pCVar2;
            local_58 = local_58 + 1;
            piVar6 = (LPINT)((long)Flags_local + 1);
          }
          *local_58 = '\0';
          iVar3 = atoi(__nptr);
          *Precision = iVar3;
          if (*Precision < 0) {
            SetLastError(0x54f);
            return 0;
          }
        }
      }
      if (**Fmt == 'p') {
        *Prefix = 3;
      }
      if (((**Fmt == 'I') && ((*Fmt)[1] == '6')) && ((*Fmt)[2] == '4')) {
        *Fmt = *Fmt + 3;
        *Prefix = 3;
      }
      else if (**Fmt == 'h') {
        *Prefix = 1;
        *Fmt = *Fmt + 1;
      }
      else if ((**Fmt == 'l') || (**Fmt == 'w')) {
        *Fmt = *Fmt + 1;
        if ((**Fmt == 'c') || (**Fmt == 's')) {
          *Prefix = 2;
        }
      }
      else if (**Fmt == 'L') {
        *Fmt = *Fmt + 1;
      }
      if ((**Fmt == 'c') || (**Fmt == 'C')) {
        *Type = 1;
        if ((*Prefix != 1) && (**Fmt == 'C')) {
          *Prefix = 2;
        }
        if (*Prefix == 2) {
          *(undefined1 *)Flags_local = 0x6c;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        *(undefined1 *)Flags_local = 99;
        *Fmt = *Fmt + 1;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      else if ((**Fmt == 's') || (**Fmt == 'S')) {
        *Type = 2;
        if ((*Prefix != 1) && (**Fmt == 'S')) {
          *Prefix = 2;
        }
        if (*Prefix == 2) {
          *(undefined1 *)Flags_local = 0x6c;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        *(undefined1 *)Flags_local = 0x73;
        *Fmt = *Fmt + 1;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      else if ((((**Fmt == 'd') || (**Fmt == 'i')) || (**Fmt == 'o')) ||
              (((**Fmt == 'u' || (**Fmt == 'x')) || (**Fmt == 'X')))) {
        *Type = 4;
        if (*Prefix == 1) {
          *(undefined1 *)Flags_local = 0x68;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        else if (*Prefix == 2) {
          *(undefined1 *)Flags_local = 0x6c;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        else if (*Prefix == 3) {
          puVar5 = (undefined1 *)((long)Flags_local + 1);
          *(undefined1 *)Flags_local = 0x6c;
          Flags_local = (LPINT)((long)Flags_local + 2);
          *puVar5 = 0x6c;
        }
        pCVar2 = *Fmt;
        *Fmt = pCVar2 + 1;
        *(CHAR *)Flags_local = *pCVar2;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      else if (((**Fmt == 'e') || (**Fmt == 'E')) ||
              ((**Fmt == 'f' || ((**Fmt == 'g' || (**Fmt == 'G')))))) {
        *Type = 7;
        pCVar2 = *Fmt;
        *Fmt = pCVar2 + 1;
        *(CHAR *)Flags_local = *pCVar2;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      else if (**Fmt == 'n') {
        if (*Prefix == 1) {
          *(undefined1 *)Flags_local = 0x68;
          Flags_local = (LPINT)((long)Flags_local + 1);
        }
        pCVar2 = *Fmt;
        *Fmt = pCVar2 + 1;
        *(CHAR *)Flags_local = *pCVar2;
        *Type = 6;
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      else if (**Fmt == 'p') {
        *Type = 5;
        pCVar2 = *Fmt;
        *Fmt = pCVar2 + 1;
        *(CHAR *)Flags_local = *pCVar2;
        if (*Prefix == 3) {
          if (*Precision == -1) {
            *Precision = 0x10;
          }
        }
        else if (*Precision == -1) {
          *Precision = 8;
        }
        TempStr._4_4_ = 1;
        Flags_local = (LPINT)((long)Flags_local + 1);
      }
      *(undefined1 *)Flags_local = 0;
      PAL_free(__nptr);
      Fmt_local._4_4_ = TempStr._4_4_;
    }
  }
  return Fmt_local._4_4_;
}

Assistant:

BOOL Silent_ExtractFormatA(LPCSTR *Fmt, LPSTR Out, LPINT Flags, LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) PAL_malloc(strlen(*Fmt)+1);
    if (!TempStr)
    {
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
        case '-':
            *Flags |= PFF_MINUS; break;
        case '+':
            *Flags |= PFF_PLUS; break;
        case '0':
            *Flags |= PFF_ZERO; break;
        case ' ':
            *Flags |= PFF_SPACE; break;
        case '#':
            *Flags |= PFF_POUND; break;
        }
            *Out++ = *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit((unsigned char) **Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit((unsigned char) **Fmt))
        {
            *TempStrPtr++ = **Fmt;
            *Out++ = *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit((unsigned char) **Fmt))
            {
               *Out++ = *(*Fmt)++;
            }
        }
    }


    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit((unsigned char) **Fmt))
            {
                *TempStrPtr++ = **Fmt;
                *Out++ = *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = *(*Fmt)++;
            if (isdigit((unsigned char) **Fmt))
            {
                /* this is an invalid precision because we have a .* then a
                   number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit((unsigned char) **Fmt))
                {
                    *Out++ = *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    /* grab prefix of 'I64' for __int64 */
    if ((*Fmt)[0] == 'I' && (*Fmt)[1] == '6' && (*Fmt)[2] == '4')
    {
        /* convert to 'll' so BSD's snprintf can handle it */
        *Fmt += 3;
        *Prefix = PFF_PREFIX_LONGLONG;
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    /* grab prefix of 'l' or the undocumented 'w' (at least in MSDN) */
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
#ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'c' || **Fmt == 's')
#endif       
        {
            *Prefix = PFF_PREFIX_LONG;
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }

    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'C')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S')
    {
        *Type = PFF_TYPE_STRING;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'S')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        *Out++ = *(*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
            }
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
            }
        }
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    PAL_free(TempStr);
    return Result;
}